

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O2

void __thiscall
timertt::details::
timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::clear_all(timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
            *this)

{
  timer_type *t;
  
  while (t = this->m_head, t != (timer_type *)0x0) {
    this->m_head = t->m_next;
    *(undefined4 *)&(t->super_timer_object<timertt::thread_safety::unsafe>).field_0xc = 0;
    timer_object<timertt::thread_safety::unsafe>::decrement_references
              (&t->super_timer_object<timertt::thread_safety::unsafe>);
  }
  (this->
  super_engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  ).m_timer_quantities.m_single_shot_count = 0;
  (this->
  super_engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  ).m_timer_quantities.m_periodic_count = 0;
  this->m_tail = (timer_type *)0x0;
  return;
}

Assistant:

void
	clear_all()
	{
		while( m_head )
		{
			auto t = m_head;
			m_head = m_head->m_next;

			t->m_status = timer_status::deactivated;
			timer_object< THREAD_SAFETY >::decrement_references( t );
		}

		// There are no more timers in the list.
		this->reset_timer_count();
		m_tail = nullptr;
	}